

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

natwm_error map_insert_entry(map *map,map_entry *entry)

{
  map_entry *entry_00;
  _Bool _Var1;
  _Bool _Var2;
  int resize_direction_00;
  size_t sVar3;
  uint initial_index_00;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  natwm_error error;
  natwm_error resize_error;
  int resize_direction;
  size_t key_size;
  _Bool is_hash_collision;
  map_entry *present_entry;
  uint32_t initial_index;
  map_entry *entry_local;
  map *map_local;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar4 [16];
  
  initial_index_00 = entry->hash % map->length;
  entry_00 = map->entries[initial_index_00];
  _Var1 = is_entry_present(entry_00);
  sVar3 = (*map->key_size_function)(entry->key);
  auVar5._8_56_ = extraout_var;
  auVar5._0_8_ = extraout_XMM0_Qa;
  auVar4 = auVar5._0_16_;
  if (_Var1) {
    _Var2 = (*map->key_compare_function)(entry->key,entry_00->key,sVar3);
    auVar6._8_56_ = extraout_var_00;
    auVar6._0_8_ = extraout_XMM0_Qa_00;
    auVar4 = auVar6._0_16_;
    if (_Var2) {
      map_entry_destroy(map,entry_00);
      map->entries[initial_index_00] = entry;
      return NO_ERROR;
    }
  }
  auVar4 = vcvtusi2sd_avx512f(auVar4,map->bucket_count);
  resize_direction_00 = get_resize_direction(map,auVar4._0_8_ + 1.0);
  if (resize_direction_00 == 0) {
    if (_Var1) {
      if (map->length < map->bucket_count + 1) {
        map_entry_destroy(map,entry);
        map_local._4_4_ = CAPACITY_ERROR;
      }
      else {
        map_local._4_4_ = map_probe(map,entry,initial_index_00);
        if (map_local._4_4_ == NO_ERROR) {
          map->bucket_count = map->bucket_count + 1;
          map_local._4_4_ = NO_ERROR;
        }
      }
    }
    else {
      if ((map->entries[initial_index_00] != (map_entry *)0x0) &&
         ((int *)map->entries[initial_index_00]->value == &EMPTY_ENTRY)) {
        map_entry_destroy(map,map->entries[initial_index_00]);
      }
      map->entries[initial_index_00] = entry;
      map->bucket_count = map->bucket_count + 1;
      map_local._4_4_ = NO_ERROR;
    }
  }
  else {
    map_local._4_4_ = map_resize(map,resize_direction_00);
    if (map_local._4_4_ == NO_ERROR) {
      map_local._4_4_ = map_insert_entry(map,entry);
    }
  }
  return map_local._4_4_;
}

Assistant:

static enum natwm_error map_insert_entry(struct map *map, struct map_entry *entry)
{
        // Get the new initial idex
        uint32_t initial_index = entry->hash % map->length;
        struct map_entry *present_entry = map->entries[initial_index];
        bool is_hash_collision = is_entry_present(present_entry);
        size_t key_size = map->key_size_function(entry->key);

        // If there is a collision with the same key overwrite it
        if (is_hash_collision
            && map->key_compare_function(entry->key, present_entry->key, key_size)) {
                map_entry_destroy(map, present_entry);

                map->entries[initial_index] = entry;

                return NO_ERROR;
        }

        // Now we need to increase map->bucket_count
        int resize_direction = get_resize_direction(map, map->bucket_count + 1.0);

        if (resize_direction != 0) {
                enum natwm_error resize_error = map_resize(map, resize_direction);

                if (resize_error != NO_ERROR) {
                        return resize_error;
                }

                // Insert with the new size
                return map_insert_entry(map, entry);
        }

        if (!is_hash_collision) {
                // No collision - just insert here
                if (map->entries[initial_index] != NULL
                    && map->entries[initial_index]->value == &EMPTY_ENTRY) {
                        // We previously had a value here - delete it and
                        // replace
                        map_entry_destroy(map, map->entries[initial_index]);
                }

                map->entries[initial_index] = entry;
                map->bucket_count += 1;

                return NO_ERROR;
        }

        if ((map->bucket_count + 1) > map->length) {
                map_entry_destroy(map, entry);

                return CAPACITY_ERROR;
        }

        // Handle collision
        enum natwm_error error = map_probe(map, entry, initial_index);

        if (error != NO_ERROR) {
                return error;
        }

        map->bucket_count += 1;

        return NO_ERROR;
}